

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileSize.cpp
# Opt level: O0

int64_t blc::tools::fileSize(string *file)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  string *in_RDI;
  int64_t len;
  ifstream ifile;
  undefined1 local_240 [16];
  streamoff local_230;
  undefined4 local_228;
  undefined1 local_218 [528];
  streamoff local_8;
  
  _Var2 = std::operator|(_S_in,_S_bin);
  _Var2 = std::operator|(_Var2,_S_ate);
  std::ifstream::ifstream(local_218,in_RDI,_Var2);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_8 = -1;
  }
  else {
    std::istream::seekg((long)local_218,_S_beg);
    local_240 = std::istream::tellg();
    local_230 = std::fpos::operator_cast_to_long((fpos *)local_240);
    std::istream::seekg((long)local_218,_S_beg);
    std::ifstream::close();
    local_8 = local_230;
  }
  local_228 = 1;
  std::ifstream::~ifstream(local_218);
  return local_8;
}

Assistant:

int64_t blc::tools::fileSize(const std::string &file) {
	std::ifstream ifile(file, std::ios::in|std::ios::binary|std::ios::ate);

	if (ifile.is_open() == false)
		return (-1);
	ifile.seekg(0, ifile.end);
	int64_t len = ifile.tellg();
	ifile.seekg(0, ifile.beg);

	ifile.close();

	return (len);
}